

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clacon2.c
# Opt level: O0

int clacon2_(int *n,singlecomplex *v,singlecomplex *x,float *est,int *kase,int *isave)

{
  int iVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  float safmin;
  float temp;
  int i;
  float estold;
  float altsgn;
  int jlast;
  float d__1;
  singlecomplex one;
  singlecomplex zero;
  int c__1;
  int *isave_local;
  int *kase_local;
  float *est_local;
  singlecomplex *x_local;
  singlecomplex *v_local;
  int *n_local;
  
  zero.r = 1.4013e-45;
  unique0x100005c4 = isave;
  memset(&one,0,8);
  fVar3 = smach("Safe minimum");
  if (*kase == 0) {
    for (safmin = 0.0; (int)safmin < *n; safmin = (float)((int)safmin + 1)) {
      x[(int)safmin].r = 1.0 / (float)*n;
      x[(int)safmin].i = 0.0;
    }
    *kase = 1;
    *stack0xffffffffffffffc0 = 1;
    return 0;
  }
  switch(*stack0xffffffffffffffc0) {
  case 1:
  default:
    if (*n == 1) {
      *v = *x;
      dVar5 = c_abs(v);
      *est = (float)dVar5;
LAB_0011b773:
      *kase = 0;
    }
    else {
      dVar5 = scsum1_slu(n,x,(int *)&zero);
      *est = (float)dVar5;
      for (safmin = 0.0; (int)safmin < *n; safmin = (float)((int)safmin + 1)) {
        dVar5 = c_abs(x + (int)safmin);
        if ((float)dVar5 <= fVar3) {
          x[(int)safmin].r = 1.0;
          x[(int)safmin].i = 0.0;
        }
        else {
          fVar4 = 1.0 / (float)dVar5;
          x[(int)safmin].r = fVar4 * x[(int)safmin].r;
          x[(int)safmin].i = fVar4 * x[(int)safmin].i;
        }
      }
      *kase = 2;
      *stack0xffffffffffffffc0 = 2;
    }
    break;
  case 2:
    iVar1 = icmax1_slu(n,x,(int *)&zero);
    stack0xffffffffffffffc0[1] = iVar1;
    stack0xffffffffffffffc0[1] = stack0xffffffffffffffc0[1] + -1;
    stack0xffffffffffffffc0[2] = 2;
    goto LAB_0011b424;
  case 3:
    ccopy_(n,x,(integer *)&zero,v,(integer *)&zero);
    fVar4 = *est;
    dVar5 = scsum1_slu(n,v,(int *)&zero);
    *est = (float)dVar5;
    if (fVar4 < *est) {
      for (safmin = 0.0; (int)safmin < *n; safmin = (float)((int)safmin + 1)) {
        dVar5 = c_abs(x + (int)safmin);
        if ((float)dVar5 <= fVar3) {
          x[(int)safmin].r = 1.0;
          x[(int)safmin].i = 0.0;
        }
        else {
          fVar4 = 1.0 / (float)dVar5;
          x[(int)safmin].r = fVar4 * x[(int)safmin].r;
          x[(int)safmin].i = fVar4 * x[(int)safmin].i;
        }
      }
      *kase = 2;
      *stack0xffffffffffffffc0 = 4;
      return 0;
    }
LAB_0011b63c:
    i = 0x3f800000;
    for (safmin = 1.4013e-45; (int)safmin <= *n; safmin = (float)((int)safmin + 1)) {
      x[(int)safmin + -1].r = (float)i * ((float)((int)safmin + -1) / (float)(*n + -1) + 1.0);
      x[(int)safmin + -1].i = 0.0;
      i = i ^ 0x80000000;
    }
    *kase = 1;
    *stack0xffffffffffffffc0 = 5;
    return 0;
  case 4:
    iVar1 = stack0xffffffffffffffc0[1];
    iVar2 = icmax1_slu(n,x,(int *)&zero);
    stack0xffffffffffffffc0[1] = iVar2;
    stack0xffffffffffffffc0[1] = stack0xffffffffffffffc0[1] + -1;
    dVar5 = (double)((ulong)(double)x[stack0xffffffffffffffc0[1]].r & (ulong)DAT_00123c10);
    if ((((double)x[iVar1].r == dVar5) && (!NAN((double)x[iVar1].r) && !NAN(dVar5))) ||
       (4 < stack0xffffffffffffffc0[2])) goto LAB_0011b63c;
    stack0xffffffffffffffc0[2] = stack0xffffffffffffffc0[2] + 1;
LAB_0011b424:
    for (safmin = 0.0; (int)safmin < *n; safmin = (float)((int)safmin + 1)) {
      x[(int)safmin] = one;
    }
    iVar1 = stack0xffffffffffffffc0[1];
    x[iVar1].r = 1.0;
    x[iVar1].i = 0.0;
    *kase = 1;
    *stack0xffffffffffffffc0 = 3;
    break;
  case 5:
    dVar5 = scsum1_slu(n,x,(int *)&zero);
    fVar3 = (float)((dVar5 / (double)(*n * 3)) * 2.0);
    if (*est <= fVar3 && fVar3 != *est) {
      ccopy_(n,x,(integer *)&zero,v,(integer *)&zero);
      *est = fVar3;
    }
    goto LAB_0011b773;
  }
  return 0;
}

Assistant:

int
clacon2_(int *n, singlecomplex *v, singlecomplex *x, float *est, int *kase, int isave[3])
{
    /* Table of constant values */
    int c__1 = 1;
    singlecomplex      zero = {0.0, 0.0};
    singlecomplex      one = {1.0, 0.0};

    /* System generated locals */
    float d__1;
    
    /* Local variables */
    int jlast;
    float altsgn, estold;
    int i;
    float temp;
    float safmin;
    extern float smach(char *);
    extern int icmax1_slu(int *, singlecomplex *, int *);
    extern double scsum1_slu(int *, singlecomplex *, int *);
    extern void ccopy_(int *, singlecomplex *, int *, singlecomplex *, int *);

    safmin = smach("Safe minimum");
    if ( *kase == 0 ) {
	for (i = 0; i < *n; ++i) {
	    x[i].r = 1. / (float) (*n);
	    x[i].i = 0.;
	}
	*kase = 1;
	isave[0] = 1;	/* jump = 1; */
	return 0;
    }

    switch (isave[0]) {
	case 1:  goto L20;
	case 2:  goto L40;
	case 3:  goto L70;
	case 4:  goto L110;
	case 5:  goto L140;
    }

    /*     ................ ENTRY   (isave[0] == 1)   
	   FIRST ITERATION.  X HAS BEEN OVERWRITTEN BY A*X. */
  L20:
    if (*n == 1) {
	v[0] = x[0];
	*est = c_abs(&v[0]);
	/*        ... QUIT */
	goto L150;
    }
    *est = scsum1_slu(n, x, &c__1);

    for (i = 0; i < *n; ++i) {
	d__1 = c_abs(&x[i]);
	if (d__1 > safmin) {
	    d__1 = 1 / d__1;
	    x[i].r *= d__1;
	    x[i].i *= d__1;
	} else {
	    x[i] = one;
	}
    }
    *kase = 2;
    isave[0] = 2;  /* jump = 2; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 2)   
	   FIRST ITERATION.  X HAS BEEN OVERWRITTEN BY TRANSPOSE(A)*X. */
L40:
    isave[1] = icmax1_slu(n, &x[0], &c__1);  /* j */
    --isave[1];  /* --j; */
    isave[2] = 2; /* iter = 2; */

    /*     MAIN LOOP - ITERATIONS 2,3,...,ITMAX. */
L50:
    for (i = 0; i < *n; ++i) x[i] = zero;
    x[isave[1]] = one;
    *kase = 1;
    isave[0] = 3;  /* jump = 3; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 3)   
	   X HAS BEEN OVERWRITTEN BY A*X. */
L70:
#ifdef _CRAY
    CCOPY(n, x, &c__1, v, &c__1);
#else
    ccopy_(n, x, &c__1, v, &c__1);
#endif
    estold = *est;
    *est = scsum1_slu(n, v, &c__1);


L90:
    /*     TEST FOR CYCLING. */
    if (*est <= estold) goto L120;

    for (i = 0; i < *n; ++i) {
	d__1 = c_abs(&x[i]);
	if (d__1 > safmin) {
	    d__1 = 1 / d__1;
	    x[i].r *= d__1;
	    x[i].i *= d__1;
	} else {
	    x[i] = one;
	}
    }
    *kase = 2;
    isave[0] = 4;  /* jump = 4; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 4)
	   X HAS BEEN OVERWRITTEN BY TRANSPOSE(A)*X. */
L110:
    jlast = isave[1];  /* j; */
    isave[1] = icmax1_slu(n, &x[0], &c__1); /* j */
    isave[1] = isave[1] - 1;  /* --j; */
    if (x[jlast].r != (d__1 = x[isave[1]].r, fabs(d__1)) && isave[2] < 5) {
	isave[2] = isave[2] + 1;  /* ++iter; */
	goto L50;
    }

    /*     ITERATION COMPLETE.  FINAL STAGE. */
L120:
    altsgn = 1.;
    for (i = 1; i <= *n; ++i) {
	x[i-1].r = altsgn * ((float)(i - 1) / (float)(*n - 1) + 1.);
	x[i-1].i = 0.;
	altsgn = -altsgn;
    }
    *kase = 1;
    isave[0] = 5;  /* jump = 5; */
    return 0;
    
    /*     ................ ENTRY   (isave[0] = 5)   
	   X HAS BEEN OVERWRITTEN BY A*X. */
L140:
    temp = scsum1_slu(n, x, &c__1) / (float)(*n * 3) * 2.;
    if (temp > *est) {
#ifdef _CRAY
	CCOPY(n, &x[0], &c__1, &v[0], &c__1);
#else
	ccopy_(n, &x[0], &c__1, &v[0], &c__1);
#endif
	*est = temp;
    }

L150:
    *kase = 0;
    return 0;

}